

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O0

int BN_set_bit(BIGNUM *a,int n)

{
  int iVar1;
  int iVar2;
  BIGNUM *pBVar3;
  int iVar4;
  int k;
  int j;
  int i;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int local_4;
  
  if (n < 0) {
    local_4 = 0;
  }
  else {
    iVar1 = n / 0x40;
    iVar4 = n % 0x40;
    if (a->top <= iVar1) {
      pBVar3 = bn_wexpand((BIGNUM *)CONCAT44(iVar4,in_stack_ffffffffffffffe0),
                          in_stack_ffffffffffffffdc);
      if (pBVar3 == (BIGNUM *)0x0) {
        return 0;
      }
      for (iVar2 = a->top; iVar2 < iVar1 + 1; iVar2 = iVar2 + 1) {
        a->d[iVar2] = 0;
      }
      a->top = iVar1 + 1;
    }
    a->d[iVar1] = 1L << ((byte)iVar4 & 0x3f) | a->d[iVar1];
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int BN_set_bit(BIGNUM *a, int n)
{
    int i, j, k;

    if (n < 0)
        return 0;

    i = n / BN_BITS2;
    j = n % BN_BITS2;
    if (a->top <= i) {
        if (bn_wexpand(a, i + 1) == NULL)
            return (0);
        for (k = a->top; k < i + 1; k++)
            a->d[k] = 0;
        a->top = i + 1;
    }

    a->d[i] |= (((BN_ULONG)1) << j);
    bn_check_top(a);
    return (1);
}